

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O0

int mpt::find_item(void *ptr,identifier *id,convertable *conv,collection *sub)

{
  bool bVar1;
  int iVar2;
  convertable *__s;
  undefined8 uStack_78;
  int ret;
  item_match tmp;
  char *sep;
  char *next;
  item_match *ctx;
  collection *sub_local;
  convertable *conv_local;
  identifier *id_local;
  void *ptr_local;
  
  if (id == (identifier *)0x0) {
    ptr_local._4_4_ = 0;
  }
  else {
    bVar1 = identifier::equal(id,*(char **)((long)ptr + 8),(int)*(undefined8 *)((long)ptr + 0x10));
    if (bVar1) {
      if (*(long *)((long)ptr + 0x18) == 0) {
        if (conv == (convertable *)0x0) {
          ptr_local._4_4_ = 1;
        }
        else if ((*(long *)((long)ptr + 0x20) == 0) ||
                (iVar2 = (**conv->_vptr_convertable)(conv,*(undefined8 *)((long)ptr + 0x20),0),
                -1 < iVar2)) {
          *(convertable **)ptr = conv;
          ptr_local._4_4_ = 0x101;
        }
        else {
          ptr_local._4_4_ = 1;
        }
      }
      else if (sub == (collection *)0x0) {
        ptr_local._4_4_ = 0;
      }
      else {
        __s = (convertable *)(*(long *)((long)ptr + 8) + *(long *)((long)ptr + 0x10) + 1);
        tmp._40_8_ = memchr(__s,(int)*(char *)((long)ptr + 0x28),*(size_t *)((long)ptr + 0x18));
        memcpy(&stack0xffffffffffffff88,ptr,0x30);
        if (tmp._40_8_ == 0) {
          tmp.ident = (char *)tmp.curr;
          tmp.curr = 0;
        }
        else {
          tmp.ident = (char *)(tmp._40_8_ - (long)__s);
          tmp.curr = tmp.curr - (long)(tmp.ident + 1);
        }
        tmp.conv = __s;
        ptr_local._4_4_ = (**sub->_vptr_collection)(sub,find_item,&stack0xffffffffffffff88);
        if (-1 < (int)ptr_local._4_4_) {
          *(undefined8 *)ptr = uStack_78;
          ptr_local._4_4_ = ptr_local._4_4_ | 2;
        }
      }
    }
    else {
      ptr_local._4_4_ = 0;
    }
  }
  return ptr_local._4_4_;
}

Assistant:

static int find_item(void *ptr, const identifier *id, convertable *conv, const collection *sub)
{
	struct item_match *ctx = static_cast<item_match *>(ptr);
	if (!id) {
		return 0;
	}
	// identifier must match current element
	if (!id->equal(ctx->ident, ctx->curr)) {
		return 0;
	}
	// top level entry
	if (!ctx->left) {
		if (!conv) {
			return TraverseLeafs;
		}
		// check for type compatibility
		if (ctx->type) {
			if (conv->convert(ctx->type, 0) < 0) {
				return TraverseLeafs;
			}
		}
		ctx->conv = conv;
		return TraverseStop | TraverseLeafs;
	}
	// no nested data
	if (!sub) {
		return 0;
	}
	// advance to nested element name
	const char *next = ctx->ident + ctx->curr + 1;
	const char *sep = (char *) memchr(next, ctx->sep, ctx->left);
	struct item_match tmp = *ctx;
	if (sep) {
		tmp.curr = sep - next;
		tmp.left -= (tmp.curr + 1);
	} else {
		tmp.curr = tmp.left;
		tmp.left = 0;
	}
	tmp.ident = next;
	
	// find nested element
	int ret = sub->each(find_item, &tmp);
	if (ret < 0) {
		return ret;
	}
	ctx->conv = tmp.conv;
	ret |= TraverseNonLeafs;
	return ret;
}